

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Cex.c
# Opt level: O3

Vec_Ptr_t * Llb4_Nonlin4VerifyCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  ulong *puVar2;
  uint *puVar3;
  void *pvVar4;
  bool bVar5;
  void **__ptr;
  void **ppvVar6;
  Vec_Ptr_t *__ptr_00;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  void **ppvVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  Vec_Ptr_t *pVVar15;
  uint uVar16;
  uint uVar17;
  
  iVar13 = p->iFrame;
  lVar12 = (long)iVar13;
  iVar8 = ((pAig->nRegs >> 5) + 1) - (uint)((pAig->nRegs & 0x1fU) == 0);
  uVar7 = lVar12 + 1;
  __ptr = (void **)malloc(((long)iVar8 * 4 + 8) * uVar7);
  if (-1 < lVar12) {
    ppvVar6 = __ptr + lVar12 + 1;
    uVar10 = uVar7 & 0xffffffff;
    ppvVar11 = __ptr;
    do {
      *ppvVar11 = ppvVar6;
      ppvVar11 = ppvVar11 + 1;
      ppvVar6 = (void **)((long)ppvVar6 + (long)iVar8 * 4);
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  __ptr_00 = (Vec_Ptr_t *)malloc(0x10);
  __ptr_00->nSize = (int)uVar7;
  __ptr_00->nCap = (int)uVar7;
  __ptr_00->pArray = __ptr;
  if (-1 < iVar13) {
    uVar10 = 0;
    do {
      memset(__ptr[uVar10],0,(long)(iVar8 * 4));
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  Aig_ManCleanMarkB(pAig);
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  iVar13 = pAig->nRegs;
  if (0 < iVar13) {
    iVar8 = 0;
    do {
      uVar9 = pAig->nTruePis + iVar8;
      if (((int)uVar9 < 0) || (pAig->vCis->nSize <= (int)uVar9)) goto LAB_00833cb6;
      puVar2 = (ulong *)((long)pAig->vCis->pArray[uVar9] + 0x18);
      *puVar2 = *puVar2 & 0xffffffffffffffdf;
      iVar8 = iVar8 + 1;
      iVar13 = pAig->nRegs;
    } while (iVar8 < iVar13);
  }
  uVar9 = p->nRegs;
  if (-1 < p->iFrame) {
    uVar7 = 0;
    do {
      if (0 < iVar13) {
        pVVar15 = pAig->vCis;
        uVar10 = 0;
        do {
          uVar16 = pAig->nTruePis + (int)uVar10;
          if (((int)uVar16 < 0) || (pVVar15->nSize <= (int)uVar16)) goto LAB_00833cb6;
          if ((*(byte *)((long)pVVar15->pArray[uVar16] + 0x18) & 0x20) != 0) {
            if (lVar12 < (long)uVar7) goto LAB_00833cb6;
            puVar3 = (uint *)((long)__ptr[uVar7] + (uVar10 >> 5) * 4);
            *puVar3 = *puVar3 | 1 << ((byte)uVar10 & 0x1f);
            iVar13 = pAig->nRegs;
          }
          uVar16 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar16;
        } while ((int)uVar16 < iVar13);
      }
      if (0 < pAig->nTruePis) {
        lVar14 = 0;
        do {
          if (pAig->vCis->nSize <= lVar14) goto LAB_00833cb6;
          pvVar4 = pAig->vCis->pArray[lVar14];
          *(ulong *)((long)pvVar4 + 0x18) =
               *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((uint)(&p[1].iPo)[(int)((ulong)uVar9 + lVar14) >> 5] >>
                        ((byte)((ulong)uVar9 + lVar14) & 0x1f) & 1) << 5);
          lVar14 = lVar14 + 1;
        } while (lVar14 < pAig->nTruePis);
        uVar9 = uVar9 + (int)lVar14;
      }
      pVVar15 = pAig->vObjs;
      if (0 < pVVar15->nSize) {
        lVar14 = 0;
        do {
          pvVar4 = pVVar15->pArray[lVar14];
          if ((pvVar4 != (void *)0x0) &&
             (0xfffffffd < ((uint)*(ulong *)((long)pvVar4 + 0x18) & 7) - 7)) {
            *(ulong *)((long)pvVar4 + 0x18) =
                 *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
                 (ulong)((((uint)*(ulong *)((long)pvVar4 + 0x10) ^
                          *(uint *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          >> 5) & ((uint)*(ulong *)((long)pvVar4 + 8) ^
                                  *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) +
                                           0x18) >> 5) & 1) << 5);
            pVVar15 = pAig->vObjs;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < pVVar15->nSize);
      }
      pVVar15 = pAig->vCos;
      if (0 < pVVar15->nSize) {
        lVar14 = 0;
        do {
          pvVar4 = pVVar15->pArray[lVar14];
          *(ulong *)((long)pvVar4 + 0x18) =
               *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((int)*(ulong *)((long)pvVar4 + 8) << 5 ^
                       *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20
                      );
          lVar14 = lVar14 + 1;
          pVVar15 = pAig->vCos;
        } while (lVar14 < pVVar15->nSize);
      }
      uVar16 = p->iFrame;
      if (uVar7 == uVar16) break;
      iVar13 = pAig->nRegs;
      if (0 < iVar13) {
        iVar8 = 0;
        do {
          uVar16 = pAig->nTruePos + iVar8;
          if (((((int)uVar16 < 0) || (pAig->vCos->nSize <= (int)uVar16)) ||
              (uVar17 = pAig->nTruePis + iVar8, (int)uVar17 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar17)) goto LAB_00833cb6;
          pvVar4 = pAig->vCis->pArray[uVar17];
          *(ulong *)((long)pvVar4 + 0x18) =
               *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
               (ulong)((uint)*(undefined8 *)((long)pAig->vCos->pArray[uVar16] + 0x18) & 0x20);
          iVar8 = iVar8 + 1;
          iVar13 = pAig->nRegs;
        } while (iVar8 < iVar13);
        uVar16 = p->iFrame;
      }
      bVar5 = (long)uVar7 < (long)(int)uVar16;
      uVar7 = uVar7 + 1;
    } while (bVar5);
  }
  if (uVar9 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Cex.c"
                  ,0xfb,"Vec_Ptr_t *Llb4_Nonlin4VerifyCex(Aig_Man_t *, Abc_Cex_t *)");
  }
  uVar7 = (ulong)(uint)pAig->nTruePos;
  do {
    if ((int)uVar7 < 1) {
      if (uVar7 == 0) {
        if (__ptr != (void **)0x0) {
          free(__ptr);
        }
        free(__ptr_00);
        __ptr_00 = (Vec_Ptr_t *)0x0;
      }
      goto LAB_00833c7e;
    }
    if (pAig->vCos->nSize < (int)uVar7) {
LAB_00833cb6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    lVar12 = uVar7 - 1;
    uVar7 = uVar7 - 1;
  } while ((*(byte *)((long)pAig->vCos->pArray[lVar12] + 0x18) & 0x20) == 0);
  p->iPo = (int)uVar7;
LAB_00833c7e:
  Aig_ManCleanMarkB(pAig);
  return __ptr_00;
}

Assistant:

Vec_Ptr_t * Llb4_Nonlin4VerifyCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Vec_Ptr_t * vStates;
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k, iBit = 0;
    // create storage for states
    vStates = Vec_PtrAllocSimInfo( p->iFrame+1, Abc_BitWordNum(Aig_ManRegNum(pAig)) );
    Vec_PtrCleanSimInfo( vStates, 0, Abc_BitWordNum(Aig_ManRegNum(pAig)) );
    // verify counter-example
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = 0; //Abc_InfoHasBit(p->pData, iBit++);
    // do not require equal flop count in the AIG and in the CEX
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        // save current state
        Saig_ManForEachLo( pAig, pObj, k )
            if ( pObj->fMarkB )
                Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(vStates, i), k );
        // compute new state
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
/*
    {
        unsigned * pNext;
        Vec_PtrForEachEntry( unsigned *, vStates, pNext, i )
        {
            printf( "%4d : ", i );
            Extra_PrintBinary( stdout, pNext, Aig_ManRegNum(pAig) );
            printf( "\n" );
        }
    }
*/
    assert( iBit == p->nBits );
//    if ( Aig_ManCo(pAig, p->iPo)->fMarkB == 0 )
//        Vec_PtrFreeP( &vStates );
    for ( i = Saig_ManPoNum(pAig) - 1; i >= 0; i-- )
    {
        if ( Aig_ManCo(pAig, i)->fMarkB )
        {
            p->iPo = i;
            break;
        }
    }
    if ( i == -1 )
        Vec_PtrFreeP( &vStates );
    Aig_ManCleanMarkB(pAig);
    return vStates;
}